

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O2

uint32_t * __thiscall
llvm::DataExtractor::getU32(DataExtractor *this,uint64_t *offset_ptr,uint32_t *dst,uint32_t count)

{
  ulong uVar1;
  uint8_t uVar2;
  char *Data;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ErrorAsOutParameter EVar7;
  ErrorAsOutParameter local_48;
  ErrorAsOutParameter ErrAsOut;
  
  uVar2 = this->IsLittleEndian;
  Data = (this->Data).Data;
  local_48.Err = (Error *)0x0;
  uVar3 = *offset_ptr;
  uVar5 = (ulong)count;
  uVar1 = uVar3 + uVar5 * 4;
  EVar7.Err = (Error *)0x0;
  ErrAsOut.Err = (Error *)dst;
  if ((uVar3 <= uVar1) && ((uVar3 + uVar5 * 4) - 1 < (this->Data).Length)) {
    for (lVar6 = 0; uVar5 << 2 != lVar6; lVar6 = lVar6 + 4) {
      uVar4 = getU<unsigned_int>(offset_ptr,this,uVar2 != '\0',Data,(Error *)0x0);
      *(uint *)((long)&(ErrAsOut.Err)->Payload + lVar6) = uVar4;
    }
    *offset_ptr = uVar1;
    EVar7.Err = ErrAsOut.Err;
  }
  ErrorAsOutParameter::~ErrorAsOutParameter(&local_48);
  return (uint32_t *)EVar7.Err;
}

Assistant:

uint32_t *DataExtractor::getU32(uint64_t *offset_ptr, uint32_t *dst,
                                uint32_t count) const {
  return getUs<uint32_t>(offset_ptr, dst, count, this, IsLittleEndian,
                         Data.data(), nullptr);
}